

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void refresh(game_event_type type,game_event_data *data,void *user)

{
  _Bool _Var1;
  loc local_28;
  loc target;
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  target = (loc)user;
  if ((((player->opts).opt[8] & 1U) != 0) && (_Var1 = target_sighted(), _Var1)) {
    target_get(&local_28);
    move_cursor_relative(local_28.y,local_28.x);
  }
  Term_fresh();
  return;
}

Assistant:

static void refresh(game_event_type type, game_event_data *data, void *user)
{
	/* Place cursor on player/target */
	if (OPT(player, show_target) && target_sighted()) {
		struct loc target;
		target_get(&target);
		move_cursor_relative(target.y, target.x);
	}

	Term_fresh();
}